

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

void __thiscall
gl3cts::InputVariablesCannotBeModifiedTest::getIterationData
          (InputVariablesCannotBeModifiedTest *this,_test_iteration iteration,
          ApiType *out_required_min_context_type_ptr,_shader_stage *out_target_shader_stage_ptr,
          string *out_body_ptr)

{
  ApiType AVar1;
  ostream *poVar2;
  TestError *this_00;
  char *pcVar3;
  string local_220 [52];
  deUint32 local_1ec;
  stringstream local_1e8 [8];
  stringstream body_sstream;
  ostream local_1d8;
  deUint32 local_60;
  deUint32 local_5c;
  deUint32 local_58;
  deUint32 local_54;
  deUint32 local_50;
  deUint32 local_4c;
  deUint32 local_48;
  deUint32 local_44;
  deUint32 local_40;
  deUint32 local_3c;
  deUint32 local_38;
  deUint32 local_34;
  string *local_30;
  string *out_body_ptr_local;
  _shader_stage *out_target_shader_stage_ptr_local;
  ApiType *out_required_min_context_type_ptr_local;
  InputVariablesCannotBeModifiedTest *pIStack_10;
  _test_iteration iteration_local;
  InputVariablesCannotBeModifiedTest *this_local;
  
  local_30 = out_body_ptr;
  out_body_ptr_local = (string *)out_target_shader_stage_ptr;
  out_target_shader_stage_ptr_local = &out_required_min_context_type_ptr->m_bits;
  out_required_min_context_type_ptr_local._4_4_ = iteration;
  pIStack_10 = this;
  switch(iteration) {
  case TEST_ITERATION_FIRST:
    local_34 = (deUint32)glu::ApiType::core(3,1);
    *out_target_shader_stage_ptr_local = local_34;
    *(undefined4 *)out_body_ptr_local = 0;
    std::__cxx11::string::operator=
              ((string *)local_30,
               "#version 140\n\nin  vec4 data;\nout vec4 result;\n\nvoid main()\n{\n    data   += vec4(1.0);\n    result  = data;\n}\n"
              );
    break;
  case TEST_ITERATION_INPUT_FS_VARIABLE_IN_INPUT_BLOCK:
    local_38 = (deUint32)glu::ApiType::core(4,0);
    *out_target_shader_stage_ptr_local = local_38;
    *(undefined4 *)out_body_ptr_local = 0;
    std::__cxx11::string::operator=
              ((string *)local_30,
               "#version 400\n\nin inputBlock\n{\n    vec4 data;\n};\n\nout vec4 result;\n\nvoid main()\n{\n    data   += vec4(1.0);\n    result  = data;\n}\n"
              );
    break;
  case TEST_ITERATION_INPUT_FS_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
    local_3c = (deUint32)glu::ApiType::core(3,1);
    *out_target_shader_stage_ptr_local = local_3c;
    *(undefined4 *)out_body_ptr_local = 0;
    std::__cxx11::string::operator=
              ((string *)local_30,
               "#version 140\n\nin  vec4 data;\nout vec4 result;\n\nvoid testFunc(inout vec4 arg)\n{\n    arg += vec4(1.0);\n}\n\nvoid main()\n{\n    testFunc(data);\n\n    result = data;\n}\n"
              );
    break;
  case TEST_ITERATION_INPUT_FS_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
    local_40 = (deUint32)glu::ApiType::core(3,1);
    *out_target_shader_stage_ptr_local = local_40;
    *(undefined4 *)out_body_ptr_local = 0;
    std::__cxx11::string::operator=
              ((string *)local_30,
               "#version 140\n\nin  vec4 data;\nout vec4 result;\n\nvoid testFunc(out vec4 arg)\n{\n    arg = vec4(1.0);\n}\n\nvoid main()\n{\n    testFunc(data);\n\n    result = data;\n}\n"
              );
    break;
  case TEST_ITERATION_INPUT_GS_VARIABLE:
    local_44 = (deUint32)glu::ApiType::core(3,2);
    *out_target_shader_stage_ptr_local = local_44;
    *(undefined4 *)out_body_ptr_local = 1;
    std::__cxx11::string::operator=
              ((string *)local_30,
               "#version 150\n\nlayout(points)                   in;\nlayout(points, max_vertices = 1) out;\n\nin vec4 data[];\n\nvoid main()\n{\n    data[0]     += vec4(1.0);\n    gl_Position  = data[0];\n\n    EmitVertex();\n}\n"
              );
    break;
  case TEST_ITERATION_INPUT_GS_VARIABLE_IN_INPUT_BLOCK:
    local_48 = (deUint32)glu::ApiType::core(4,0);
    *out_target_shader_stage_ptr_local = local_48;
    *(undefined4 *)out_body_ptr_local = 1;
    std::__cxx11::string::operator=
              ((string *)local_30,
               "#version 400\n\nlayout(points)                   in;\nlayout(points, max_vertices = 1) out;\n\nin inputBlock\n{\n    vec4 data[];\n};\n\nvoid main()\n{\n    data[0]     += vec4(1.0);\n    gl_Position  = data[0];\n\n    EmitVertex();\n}\n"
              );
    break;
  case TEST_ITERATION_INPUT_GS_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
    local_4c = (deUint32)glu::ApiType::core(3,2);
    *out_target_shader_stage_ptr_local = local_4c;
    *(undefined4 *)out_body_ptr_local = 1;
    std::__cxx11::string::operator=
              ((string *)local_30,
               "#version 150\n\nlayout(points)                   in;\nlayout(points, max_vertices = 1) out;\n\nin vec4 data[];\n\nvoid testFunc(inout vec4 arg)\n{\n    arg += vec4(1.0);\n}\n\nvoid main()\n{\n    testFunc(data[0]);\n\n    gl_Position = data[0];\n\n    EmitVertex();\n}\n"
              );
    break;
  case TEST_ITERATION_INPUT_GS_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
    local_50 = (deUint32)glu::ApiType::core(3,2);
    *out_target_shader_stage_ptr_local = local_50;
    *(undefined4 *)out_body_ptr_local = 1;
    std::__cxx11::string::operator=
              ((string *)local_30,
               "#version 150\n\nlayout(points)                   in;\nlayout(points, max_vertices = 1) out;\n\nin vec4 data[];\n\nvoid testFunc(out vec4 arg)\n{\n    arg = vec4(1.0);\n}\n\nvoid main()\n{\n    testFunc(data[0]);\n\n    gl_Position = data[0];\n\n    EmitVertex();\n}\n"
              );
    break;
  case TEST_ITERATION_INPUT_TC_VARIABLE:
    local_54 = (deUint32)glu::ApiType::core(4,0);
    *out_target_shader_stage_ptr_local = local_54;
    *(undefined4 *)out_body_ptr_local = 2;
    std::__cxx11::string::operator=
              ((string *)local_30,
               "#version 400\n\nlayout(vertices = 4) out;\n\nin  vec4 data[];\nout vec4 result;\n\nvoid main()\n{\n    data[0] += vec4(1.0);\n    result   = data[0];\n\n}\n"
              );
    break;
  case TEST_ITERATION_INPUT_TC_VARIABLE_IN_INPUT_BLOCK:
    local_58 = (deUint32)glu::ApiType::core(4,0);
    *out_target_shader_stage_ptr_local = local_58;
    *(undefined4 *)out_body_ptr_local = 2;
    std::__cxx11::string::operator=
              ((string *)local_30,
               "#version 400\n\nlayout(vertices = 4) out;\n\nin inputBlock\n{\n    vec4 data;\n} inData[];\n\npatch out vec4 result[];\n\nvoid main()\n{\n    inData[0].data          += vec4(1.0);\n    result[gl_InvocationID]  = inData[0].data;\n\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n}\n"
              );
    break;
  case TEST_ITERATION_INPUT_TC_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
    local_5c = (deUint32)glu::ApiType::core(4,0);
    *out_target_shader_stage_ptr_local = local_5c;
    *(undefined4 *)out_body_ptr_local = 2;
    std::__cxx11::string::operator=
              ((string *)local_30,
               "#version 400\n\nlayout(vertices = 4) out;\n\nin  vec4 data[];\nout vec4 result;\n\nvoid testFunc(inout vec4 arg)\n{\n    arg += vec4(1.0);\n}\n\nvoid main()\n{\n    testFunc(data[0]);\n\n    result = data[0];\n\n}\n"
              );
    break;
  case TEST_ITERATION_INPUT_TC_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
    local_60 = (deUint32)glu::ApiType::core(4,0);
    *out_target_shader_stage_ptr_local = local_60;
    *(undefined4 *)out_body_ptr_local = 2;
    std::__cxx11::string::operator=
              ((string *)local_30,
               "#version 400\n\nlayout(vertices = 4) out;\n\nin  vec4 data[];\nout vec4 result;\n\nvoid testFunc(out vec4 arg)\n{\n    arg = vec4(1.0);\n}\n\nvoid main()\n{\n    testFunc(data[0]);\n\n    result = data[0];\n\n}\n"
              );
    break;
  case TEST_ITERATION_INPUT_TE_PATCH_VARIABLE:
  case TEST_ITERATION_INPUT_TE_VARIABLE:
    std::__cxx11::stringstream::stringstream(local_1e8);
    local_1ec = (deUint32)glu::ApiType::core(4,0);
    *out_target_shader_stage_ptr_local = local_1ec;
    *(undefined4 *)out_body_ptr_local = 3;
    poVar2 = std::operator<<(&local_1d8,"#version 400\n\nlayout(triangles) in;\n\n");
    pcVar3 = "";
    if (out_required_min_context_type_ptr_local._4_4_ == TEST_ITERATION_INPUT_TE_PATCH_VARIABLE) {
      pcVar3 = "patch ";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,"in  vec4 data[];\n");
    std::operator<<(poVar2,
                    "      out vec4 result;\n\nvoid main()\n{\n    data[0]     += vec4(1.0);\n    gl_Position  = data[0];\n}\n"
                   );
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)local_30,local_220);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::stringstream::~stringstream(local_1e8);
    break;
  case TEST_ITERATION_INPUT_TE_VARIABLE_IN_INPUT_BLOCK:
    AVar1 = glu::ApiType::core(4,0);
    *out_target_shader_stage_ptr_local = AVar1.m_bits;
    *(undefined4 *)out_body_ptr_local = 3;
    std::__cxx11::string::operator=
              ((string *)local_30,
               "#version 400\n\nlayout(triangles) in;\n\nin inputBlock\n{\n    vec4 data;\n} inData[];\n\nvoid main()\n{\n    inData[0].data += vec4(1.0);\n    gl_Position     = inData[0].data;\n}\n"
              );
    break;
  case TEST_ITERATION_INPUT_TE_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
    AVar1 = glu::ApiType::core(4,0);
    *out_target_shader_stage_ptr_local = AVar1.m_bits;
    *(undefined4 *)out_body_ptr_local = 3;
    std::__cxx11::string::operator=
              ((string *)local_30,
               "#version 400\n\nlayout(triangles) in;\n\nin  vec4 data[];\nout vec4 result;\n\nvoid testFunc(inout vec4 arg)\n{\n    arg += vec4(1.0);\n}\n\nvoid main()\n{\n    testFunc(data[0]);\n\n    gl_Position  = data[0];\n}\n"
              );
    break;
  case TEST_ITERATION_INPUT_TE_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
    AVar1 = glu::ApiType::core(4,0);
    *out_target_shader_stage_ptr_local = AVar1.m_bits;
    *(undefined4 *)out_body_ptr_local = 3;
    std::__cxx11::string::operator=
              ((string *)local_30,
               "#version 400\n\nlayout(triangles) in;\n\nin  vec4 data[];\nout vec4 result;\n\nvoid testFunc(out vec4 arg)\n{\n    arg = vec4(1.0);\n}\n\nvoid main()\n{\n    testFunc(data[0]);\n\n    gl_Position = data[0];\n}\n"
              );
    break;
  case TEST_ITERATION_INPUT_VS_VARIABLE:
    AVar1 = glu::ApiType::core(3,1);
    *out_target_shader_stage_ptr_local = AVar1.m_bits;
    *(undefined4 *)out_body_ptr_local = 4;
    std::__cxx11::string::operator=
              ((string *)local_30,
               "#version 140\n\nin vec4 data;\n\nvoid main()\n{\n    data        += vec4(1.0);\n    gl_Position  = data;\n}\n"
              );
    break;
  case TEST_ITERATION_INPUT_VS_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
    AVar1 = glu::ApiType::core(3,1);
    *out_target_shader_stage_ptr_local = AVar1.m_bits;
    *(undefined4 *)out_body_ptr_local = 4;
    std::__cxx11::string::operator=
              ((string *)local_30,
               "#version 140\n\nin vec4 data;\n\nvoid testFunc(inout vec4 argument)\n{\n    argument += vec4(1.0);\n}\n\nvoid main()\n{\n    testFunc(data);\n\n    gl_Position = data;\n}\n"
              );
    break;
  case TEST_ITERATION_INPUT_VS_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
    AVar1 = glu::ApiType::core(3,1);
    *out_target_shader_stage_ptr_local = AVar1.m_bits;
    *(undefined4 *)out_body_ptr_local = 4;
    std::__cxx11::string::operator=
              ((string *)local_30,
               "#version 140\n\nin vec4 data;\n\nvoid testFunc(out vec4 argument)\n{\n    argument = vec4(1.0);\n}\n\nvoid main()\n{\n    testFunc(data);\n\n    gl_Position = data;\n}\n"
              );
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized test iteration type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
               ,0x363);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void InputVariablesCannotBeModifiedTest::getIterationData(_test_iteration iteration,
														  glu::ApiType*   out_required_min_context_type_ptr,
														  _shader_stage*  out_target_shader_stage_ptr,
														  std::string*	out_body_ptr) const
{
	switch (iteration)
	{
	case TEST_ITERATION_INPUT_FS_VARIABLE:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(3, 1);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_FRAGMENT;

		*out_body_ptr = "#version 140\n"
						"\n"
						"in  vec4 data;\n"
						"out vec4 result;\n"
						"\n"
						"void main()\n"
						"{\n"
						"    data   += vec4(1.0);\n"
						"    result  = data;\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_FS_VARIABLE_IN_INPUT_BLOCK:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(4, 0);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_FRAGMENT;

		*out_body_ptr = "#version 400\n"
						"\n"
						"in inputBlock\n"
						"{\n"
						"    vec4 data;\n"
						"};\n"
						"\n"
						"out vec4 result;\n"
						"\n"
						"void main()\n"
						"{\n"
						"    data   += vec4(1.0);\n"
						"    result  = data;\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_FS_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(3, 1);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_FRAGMENT;

		*out_body_ptr = "#version 140\n"
						"\n"
						"in  vec4 data;\n"
						"out vec4 result;\n"
						"\n"
						"void testFunc(inout vec4 arg)\n"
						"{\n"
						"    arg += vec4(1.0);\n"
						"}\n"
						"\n"
						"void main()\n"
						"{\n"
						"    testFunc(data);\n"
						"\n"
						"    result = data;\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_FS_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(3, 1);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_FRAGMENT;

		*out_body_ptr = "#version 140\n"
						"\n"
						"in  vec4 data;\n"
						"out vec4 result;\n"
						"\n"
						"void testFunc(out vec4 arg)\n"
						"{\n"
						"    arg = vec4(1.0);\n"
						"}\n"
						"\n"
						"void main()\n"
						"{\n"
						"    testFunc(data);\n"
						"\n"
						"    result = data;\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_GS_VARIABLE:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(3, 2);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_GEOMETRY;

		*out_body_ptr = "#version 150\n"
						"\n"
						"layout(points)                   in;\n"
						"layout(points, max_vertices = 1) out;\n"
						"\n"
						"in vec4 data[];\n"
						"\n"
						"void main()\n"
						"{\n"
						"    data[0]     += vec4(1.0);\n"
						"    gl_Position  = data[0];\n"
						"\n"
						"    EmitVertex();\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_GS_VARIABLE_IN_INPUT_BLOCK:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(4, 0);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_GEOMETRY;

		*out_body_ptr = "#version 400\n"
						"\n"
						"layout(points)                   in;\n"
						"layout(points, max_vertices = 1) out;\n"
						"\n"
						"in inputBlock\n"
						"{\n"
						"    vec4 data[];\n"
						"};\n"
						"\n"
						"void main()\n"
						"{\n"
						"    data[0]     += vec4(1.0);\n"
						"    gl_Position  = data[0];\n"
						"\n"
						"    EmitVertex();\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_GS_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(3, 2);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_GEOMETRY;

		*out_body_ptr = "#version 150\n"
						"\n"
						"layout(points)                   in;\n"
						"layout(points, max_vertices = 1) out;\n"
						"\n"
						"in vec4 data[];\n"
						"\n"
						"void testFunc(inout vec4 arg)\n"
						"{\n"
						"    arg += vec4(1.0);\n"
						"}\n"
						"\n"
						"void main()\n"
						"{\n"
						"    testFunc(data[0]);\n"
						"\n"
						"    gl_Position = data[0];\n"
						"\n"
						"    EmitVertex();\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_GS_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(3, 2);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_GEOMETRY;

		*out_body_ptr = "#version 150\n"
						"\n"
						"layout(points)                   in;\n"
						"layout(points, max_vertices = 1) out;\n"
						"\n"
						"in vec4 data[];\n"
						"\n"
						"void testFunc(out vec4 arg)\n"
						"{\n"
						"    arg = vec4(1.0);\n"
						"}\n"
						"\n"
						"void main()\n"
						"{\n"
						"    testFunc(data[0]);\n"
						"\n"
						"    gl_Position = data[0];\n"
						"\n"
						"    EmitVertex();\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_TC_VARIABLE:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(4, 0);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_TESSELLATION_CONTROL;

		*out_body_ptr = "#version 400\n"
						"\n"
						"layout(vertices = 4) out;\n"
						"\n"
						"in  vec4 data[];\n"
						"out vec4 result;\n"
						"\n"
						"void main()\n"
						"{\n"
						"    data[0] += vec4(1.0);\n"
						"    result   = data[0];\n"
						"\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_TC_VARIABLE_IN_INPUT_BLOCK:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(4, 0);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_TESSELLATION_CONTROL;

		*out_body_ptr = "#version 400\n"
						"\n"
						"layout(vertices = 4) out;\n"
						"\n"
						"in inputBlock\n"
						"{\n"
						"    vec4 data;\n"
						"} inData[];\n"
						"\n"
						"patch out vec4 result[];\n"
						"\n"
						"void main()\n"
						"{\n"
						"    inData[0].data          += vec4(1.0);\n"
						"    result[gl_InvocationID]  = inData[0].data;\n"
						"\n"
						"    gl_TessLevelInner[0] = 1.0;\n"
						"    gl_TessLevelInner[1] = 1.0;\n"
						"    gl_TessLevelOuter[0] = 1.0;\n"
						"    gl_TessLevelOuter[1] = 1.0;\n"
						"    gl_TessLevelOuter[2] = 1.0;\n"
						"    gl_TessLevelOuter[3] = 1.0;\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_TC_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(4, 0);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_TESSELLATION_CONTROL;

		*out_body_ptr = "#version 400\n"
						"\n"
						"layout(vertices = 4) out;\n"
						"\n"
						"in  vec4 data[];\n"
						"out vec4 result;\n"
						"\n"
						"void testFunc(inout vec4 arg)\n"
						"{\n"
						"    arg += vec4(1.0);\n"
						"}\n"
						"\n"
						"void main()\n"
						"{\n"
						"    testFunc(data[0]);\n"
						"\n"
						"    result = data[0];\n"
						"\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_TC_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(4, 0);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_TESSELLATION_CONTROL;

		*out_body_ptr = "#version 400\n"
						"\n"
						"layout(vertices = 4) out;\n"
						"\n"
						"in  vec4 data[];\n"
						"out vec4 result;\n"
						"\n"
						"void testFunc(out vec4 arg)\n"
						"{\n"
						"    arg = vec4(1.0);\n"
						"}\n"
						"\n"
						"void main()\n"
						"{\n"
						"    testFunc(data[0]);\n"
						"\n"
						"    result = data[0];\n"
						"\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_TE_PATCH_VARIABLE:
	case TEST_ITERATION_INPUT_TE_VARIABLE:
	{
		std::stringstream body_sstream;

		*out_required_min_context_type_ptr = glu::ApiType::core(4, 0);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_TESSELLATION_EVALUATION;

		body_sstream << "#version 400\n"
						"\n"
						"layout(triangles) in;\n"
						"\n"
					 << ((iteration == TEST_ITERATION_INPUT_TE_PATCH_VARIABLE) ? "patch " : "") << "in  vec4 data[];\n"
					 << "      out vec4 result;\n"
						"\n"
						"void main()\n"
						"{\n"
						"    data[0]     += vec4(1.0);\n"
						"    gl_Position  = data[0];\n"
						"}\n";

		*out_body_ptr = body_sstream.str();
		break;
	}

	case TEST_ITERATION_INPUT_TE_VARIABLE_IN_INPUT_BLOCK:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(4, 0);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_TESSELLATION_EVALUATION;

		*out_body_ptr = "#version 400\n"
						"\n"
						"layout(triangles) in;\n"
						"\n"
						"in inputBlock\n"
						"{\n"
						"    vec4 data;\n"
						"} inData[];\n"
						"\n"
						"void main()\n"
						"{\n"
						"    inData[0].data += vec4(1.0);\n"
						"    gl_Position     = inData[0].data;\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_TE_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(4, 0);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_TESSELLATION_EVALUATION;

		*out_body_ptr = "#version 400\n"
						"\n"
						"layout(triangles) in;\n"
						"\n"
						"in  vec4 data[];\n"
						"out vec4 result;\n"
						"\n"
						"void testFunc(inout vec4 arg)\n"
						"{\n"
						"    arg += vec4(1.0);\n"
						"}\n"
						"\n"
						"void main()\n"
						"{\n"
						"    testFunc(data[0]);\n"
						"\n"
						"    gl_Position  = data[0];\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_TE_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(4, 0);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_TESSELLATION_EVALUATION;

		*out_body_ptr = "#version 400\n"
						"\n"
						"layout(triangles) in;\n"
						"\n"
						"in  vec4 data[];\n"
						"out vec4 result;\n"
						"\n"
						"void testFunc(out vec4 arg)\n"
						"{\n"
						"    arg = vec4(1.0);\n"
						"}\n"
						"\n"
						"void main()\n"
						"{\n"
						"    testFunc(data[0]);\n"
						"\n"
						"    gl_Position = data[0];\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_VS_VARIABLE:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(3, 1);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_VERTEX;

		*out_body_ptr = "#version 140\n"
						"\n"
						"in vec4 data;\n"
						"\n"
						"void main()\n"
						"{\n"
						"    data        += vec4(1.0);\n"
						"    gl_Position  = data;\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_VS_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(3, 1);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_VERTEX;

		*out_body_ptr = "#version 140\n"
						"\n"
						"in vec4 data;\n"
						"\n"
						"void testFunc(inout vec4 argument)\n"
						"{\n"
						"    argument += vec4(1.0);\n"
						"}\n"
						"\n"
						"void main()\n"
						"{\n"
						"    testFunc(data);\n"
						"\n"
						"    gl_Position = data;\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_VS_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(3, 1);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_VERTEX;

		*out_body_ptr = "#version 140\n"
						"\n"
						"in vec4 data;\n"
						"\n"
						"void testFunc(out vec4 argument)\n"
						"{\n"
						"    argument = vec4(1.0);\n"
						"}\n"
						"\n"
						"void main()\n"
						"{\n"
						"    testFunc(data);\n"
						"\n"
						"    gl_Position = data;\n"
						"}\n";

		break;
	}

	default:
		TCU_FAIL("Unrecognized test iteration type");
	} /* switch (iteration) */
}